

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UChar * ures_getStringByKey_63(UResourceBundle *resB,char *inKey,int32_t *len,UErrorCode *status)

{
  bool bVar1;
  ResourceData *pResData;
  UResourceBundle *resB_00;
  UErrorCode UVar2;
  uint uVar3;
  Resource res;
  char *key;
  UResourceDataEntry *realData;
  int32_t t;
  Resource local_44;
  char *local_40;
  UResourceDataEntry *local_38;
  int32_t local_2c;
  
  local_44 = 0xffffffff;
  local_38 = (UResourceDataEntry *)0x0;
  if (status == (UErrorCode *)0x0) {
    return (UChar *)0x0;
  }
  if (U_ZERO_ERROR < *status) {
    return (UChar *)0x0;
  }
  if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  uVar3 = resB->fRes;
  if ((uVar3 & 0xf0000000) != 0x20000000 && (uVar3 & 0xe0000000) != 0x40000000) {
    *status = U_RESOURCE_TYPE_MISMATCH;
    return (UChar *)0x0;
  }
  local_2c = 0;
  pResData = &resB->fResData;
  local_40 = inKey;
  local_44 = res_getTableItemByKey_63(pResData,uVar3,&local_2c,&local_40);
  if (local_44 == 0xffffffff) {
    if (resB->fHasFallback == '\x01') {
      local_40 = inKey;
      pResData = getFallbackData(resB,&local_40,&local_38,&local_44,status);
      UVar2 = U_MISSING_RESOURCE_ERROR;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar3 = local_44 >> 0x1c;
        if (uVar3 != 6) {
          if (uVar3 == 3) goto LAB_002c9a2c;
          UVar2 = U_RESOURCE_TYPE_MISMATCH;
          if (uVar3 != 0) goto LAB_002c99ee;
        }
        goto LAB_002c998e;
      }
LAB_002c99ee:
      *status = UVar2;
    }
    else {
      *status = U_MISSING_RESOURCE_ERROR;
    }
LAB_002c9a03:
    bVar1 = true;
  }
  else {
    if (local_44 >> 0x1c != 6) {
      if (local_44 >> 0x1c == 3) {
LAB_002c9a2c:
        bVar1 = false;
        resB_00 = ures_getByKey_63(resB,inKey,(UResourceBundle *)0x0,status);
        len = (int32_t *)ures_getString_63(resB_00,len,status);
        ures_closeBundle(resB_00,'\x01');
        goto LAB_002c9a60;
      }
      if (local_44 >> 0x1c != 0) {
        *status = U_RESOURCE_TYPE_MISMATCH;
        goto LAB_002c9a03;
      }
    }
LAB_002c998e:
    len = (int32_t *)res_getString_63(pResData,local_44,len);
    bVar1 = false;
  }
LAB_002c9a60:
  if (bVar1) {
    return (UChar *)0x0;
  }
  return (UChar *)len;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getStringByKey(const UResourceBundle *resB, const char* inKey, int32_t* len, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char* key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t=0;

        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);

        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                    switch (RES_GET_TYPE(res)) {
                    case URES_STRING:
                    case URES_STRING_V2:
                        return res_getString(rd, res, len);
                    case URES_ALIAS:
                      {
                        const UChar* result = 0;
                        UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                        result = ures_getString(tempRes, len, status);
                        ures_close(tempRes);
                        return result;
                      }
                    default:
                        *status = U_RESOURCE_TYPE_MISMATCH;
                    }
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            switch (RES_GET_TYPE(res)) {
            case URES_STRING:
            case URES_STRING_V2:
                return res_getString(&(resB->fResData), res, len);
            case URES_ALIAS:
              {
                const UChar* result = 0;
                UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                result = ures_getString(tempRes, len, status);
                ures_close(tempRes);
                return result;
              }
            default:
                *status = U_RESOURCE_TYPE_MISMATCH;
            }
        }
    } 
#if 0 
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */   
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return res_getString(rd, res, len);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    } 
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }